

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

int lys_check_id(lys_node *node,lys_node *parent,lys_module *module)

{
  uint uVar1;
  LYS_NODE LVar2;
  LYS_NODE LVar3;
  lys_node **pplVar4;
  lys_node *plVar5;
  lys_node *plVar6;
  lys_node_grp *plVar7;
  lys_node *plVar8;
  char *pcVar9;
  lys_node *plVar10;
  lys_node *plVar11;
  lys_node *plVar12;
  ly_ctx *ctx;
  char *name;
  bool bVar13;
  bool bVar14;
  
  if (node == (lys_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x24c,
                  "int lys_check_id(struct lys_node *, struct lys_node *, struct lys_module *)");
  }
  if (parent == (lys_node *)0x0) {
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                    ,0x24f,
                    "int lys_check_id(struct lys_node *, struct lys_node *, struct lys_module *)");
    }
  }
  else {
    module = parent->module;
  }
  if (module == (lys_module *)0x0) {
    module = (lys_module *)0x0;
  }
  else if ((module->field_0x40 & 1) != 0) {
    module = (lys_module *)module->data;
  }
  LVar2 = node->nodetype;
  uVar1 = LVar2 - LYS_CONTAINER;
  if (uVar1 < 0x40) {
    if ((0x808bUL >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_0015d39d;
    if ((ulong)uVar1 == 0x3f) {
      if (parent == (lys_node *)0x0) {
        pplVar4 = &module->data;
      }
      else {
        pplVar4 = lys_child(parent,LYS_CASE);
      }
      plVar5 = *pplVar4;
      while( true ) {
        if (plVar5 == (lys_node *)0x0) {
          return 0;
        }
        if ((((plVar5->nodetype & 0x807d) != LYS_UNKNOWN) && (plVar5->module == node->module)) &&
           (name = node->name, plVar5->name == name)) break;
        plVar5 = plVar5->next;
      }
      ctx = module->ctx;
      pcVar9 = "case";
      goto LAB_0015d720;
    }
  }
  if (LVar2 != LYS_ANYDATA) {
    if (LVar2 != LYS_GROUPING) {
      return 0;
    }
    if (parent == (lys_node *)0x0) {
      plVar5 = module->data;
      bVar13 = false;
      bVar14 = false;
    }
    else {
      pplVar4 = lys_child(parent,LYS_GROUPING);
      bVar13 = *pplVar4 == (lys_node *)0x0;
      plVar5 = *pplVar4;
      if (bVar13) {
        plVar5 = parent;
      }
      bVar14 = parent->nodetype == LYS_EXT;
    }
    if (!bVar14) {
      name = node->name;
      plVar7 = lys_find_grouping_up(name,plVar5);
      if (plVar7 != (lys_node_grp *)0x0) {
        ctx = module->ctx;
        pcVar9 = "grouping";
LAB_0015d720:
        ly_vlog(ctx,LYE_DUPID,LY_VLOG_LYS,node,pcVar9,name);
        return 1;
      }
    }
    if (bVar13 || plVar5 == (lys_node *)0x0) {
      return 0;
    }
    plVar8 = plVar5;
    plVar10 = (lys_node *)0x0;
    while( true ) {
      plVar6 = plVar5;
      if ((plVar10 != (lys_node *)0x0) && (plVar6 = plVar10, plVar8 == plVar10)) {
        return 0;
      }
      if ((plVar8->nodetype & (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT|LYS_LIST|LYS_CHOICE|LYS_CONTAINER))
          != LYS_UNKNOWN) break;
LAB_0015d687:
      plVar8 = plVar8->prev;
      plVar10 = plVar6;
      if (plVar8 == (lys_node *)0x0) {
        return 0;
      }
    }
    plVar10 = (lys_node *)0x0;
    do {
      plVar11 = plVar10;
      if (plVar10 == (lys_node *)0x0) {
        plVar11 = plVar8;
      }
      do {
        if ((plVar11->nodetype &
            (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT|LYS_LIST|LYS_CHOICE|LYS_CONTAINER)) == LYS_UNKNOWN) {
          plVar10 = (lys_node *)0x0;
        }
        else {
          plVar10 = plVar11->child;
        }
        if (plVar10 == (lys_node *)0x0) {
          if (plVar11 == plVar8) {
LAB_0015d671:
            plVar10 = (lys_node *)0x0;
            break;
          }
          plVar10 = plVar11->next;
        }
        while (plVar10 == (lys_node *)0x0) {
          if (plVar11 == (lys_node *)0x0) {
LAB_0015d61a:
            plVar10 = (lys_node *)0x0;
          }
          else {
            if (plVar11->nodetype == LYS_EXT) {
              if (plVar11->padding[1] != '\x01') goto LAB_0015d61a;
              plVar10 = (lys_node *)plVar11->dsc;
            }
            else {
              plVar10 = plVar11->parent;
              if (plVar10 == (lys_node *)0x0) goto LAB_0015d61a;
            }
            if (plVar10->nodetype == LYS_AUGMENT) {
              plVar10 = plVar10->prev;
            }
          }
          if (plVar10 == plVar8) goto LAB_0015d671;
          if (plVar11 == (lys_node *)0x0) {
LAB_0015d653:
            plVar12 = (lys_node *)0x0;
          }
          else {
            if (plVar11->nodetype == LYS_EXT) {
              if (plVar11->padding[1] != '\x01') goto LAB_0015d653;
              plVar12 = (lys_node *)plVar11->dsc;
            }
            else {
              plVar12 = plVar11->parent;
              if (plVar12 == (lys_node *)0x0) goto LAB_0015d653;
            }
            if (plVar12->nodetype == LYS_AUGMENT) {
              plVar12 = plVar12->prev;
            }
          }
          plVar10 = plVar11->next;
          plVar11 = plVar12;
        }
        plVar11 = plVar10;
      } while (plVar10->nodetype != LYS_GROUPING);
      if (plVar10 == (lys_node *)0x0) goto LAB_0015d687;
      name = node->name;
      if (name == plVar10->name) {
        ctx = module->ctx;
        pcVar9 = "grouping";
        goto LAB_0015d720;
      }
    } while( true );
  }
LAB_0015d39d:
  if (parent != (lys_node *)0x0) {
    do {
      LVar3 = parent->nodetype;
      if ((LVar3 & (LYS_AUGMENT|LYS_USES|LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN) {
LAB_0015d3da:
        if (LVar3 != LYS_EXT) {
          pplVar4 = &parent->child;
          goto LAB_0015d45f;
        }
        pplVar4 = lys_child(parent,LVar2);
        if (pplVar4 != (lys_node **)0x0) goto LAB_0015d45f;
        plVar5 = (lys_node *)0x0;
        goto joined_r0x0015d465;
      }
      if (LVar3 == LYS_AUGMENT) {
        plVar5 = parent->prev;
        if (plVar5 == (lys_node *)0x0) goto LAB_0015d3da;
      }
      else {
        plVar5 = parent->parent;
      }
      parent = plVar5;
    } while (plVar5 != (lys_node *)0x0);
  }
  pplVar4 = &module->data;
  parent = (lys_node *)0x0;
LAB_0015d45f:
  plVar5 = *pplVar4;
joined_r0x0015d465:
  do {
    if (plVar5 == (lys_node *)0x0) {
      return 0;
    }
    LVar2 = plVar5->nodetype;
    if ((LVar2 & (LYS_USES|LYS_CASE)) == LYS_UNKNOWN) {
      if ((((LVar2 & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CHOICE|LYS_CONTAINER)) !=
            LYS_UNKNOWN) && (plVar5->module == node->module)) && (plVar5->name == node->name)) {
        ctx = module->ctx;
        pcVar9 = strnodetype(node->nodetype);
        name = node->name;
        goto LAB_0015d720;
      }
      if (LVar2 == LYS_CHOICE) goto LAB_0015d499;
      if (plVar5->next == (lys_node *)0x0) {
        plVar10 = plVar5->parent;
        plVar8 = plVar5;
        while (plVar6 = plVar10, plVar5 = parent, plVar6 != parent) {
          if (plVar8 == (lys_node *)0x0) {
LAB_0015d4eb:
            plVar6 = (lys_node *)0x0;
          }
          else {
            if (plVar8->nodetype == LYS_EXT) {
              if (plVar8->padding[1] != '\x01') goto LAB_0015d4eb;
              plVar6 = (lys_node *)plVar8->dsc;
            }
            else if (plVar6 == (lys_node *)0x0) goto LAB_0015d4eb;
            if (plVar6->nodetype == LYS_AUGMENT) {
              plVar6 = plVar6->prev;
            }
          }
          plVar5 = plVar6;
          if (plVar6 == (lys_node *)0x0) {
            if (parent == (lys_node *)0x0) break;
          }
          else if ((plVar6 == parent) || (plVar6->next != (lys_node *)0x0)) break;
          plVar8 = plVar6;
          plVar10 = plVar6->parent;
        }
        if (plVar5 == parent) {
          return 0;
        }
      }
      pplVar4 = &plVar5->next;
    }
    else {
LAB_0015d499:
      pplVar4 = &plVar5->child;
    }
    plVar5 = *pplVar4;
  } while( true );
}

Assistant:

int
lys_check_id(struct lys_node *node, struct lys_node *parent, struct lys_module *module)
{
    struct lys_node *start, *stop, *iter;
    struct lys_node_grp *grp;
    int down, up;

    assert(node);

    if (!parent) {
        assert(module);
    } else {
        module = parent->module;
    }
    module = lys_main_module(module);

    switch (node->nodetype) {
    case LYS_GROUPING:
        /* 6.2.1, rule 6 */
        if (parent) {
            start = *lys_child(parent, LYS_GROUPING);
            if (!start) {
                down = 0;
                start = parent;
            } else {
                down = 1;
            }
            if (parent->nodetype == LYS_EXT) {
                up = 0;
            } else {
                up = 1;
            }
        } else {
            down = up = 1;
            start = module->data;
        }
        /* go up */
        if (up && lys_find_grouping_up(node->name, start)) {
            LOGVAL(module->ctx, LYE_DUPID, LY_VLOG_LYS, node, "grouping", node->name);
            return EXIT_FAILURE;
        }
        /* go down, because grouping can be defined after e.g. container in which is collision */
        if (down) {
            for (iter = start, stop = NULL; iter; iter = iter->prev) {
                if (!stop) {
                    stop = start;
                } else if (iter == stop) {
                    break;
                }
                if (!(iter->nodetype & (LYS_CONTAINER | LYS_CHOICE | LYS_LIST | LYS_GROUPING | LYS_INPUT | LYS_OUTPUT))) {
                    continue;
                }

                grp = NULL;
                while ((grp = lys_get_next_grouping(grp, iter))) {
                    if (ly_strequal(node->name, grp->name, 1)) {
                        LOGVAL(module->ctx, LYE_DUPID,LY_VLOG_LYS, node, "grouping", node->name);
                        return EXIT_FAILURE;
                    }
                }
            }
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_LIST:
    case LYS_CONTAINER:
    case LYS_CHOICE:
    case LYS_ANYDATA:
        /* 6.2.1, rule 7 */
        if (parent) {
            iter = parent;
            while (iter && (iter->nodetype & (LYS_USES | LYS_CASE | LYS_CHOICE | LYS_AUGMENT))) {
                if (iter->nodetype == LYS_AUGMENT) {
                    if (((struct lys_node_augment *)iter)->target) {
                        /* augment is resolved, go up */
                        iter = ((struct lys_node_augment *)iter)->target;
                        continue;
                    }
                    /* augment is not resolved, this is the final parent */
                    break;
                }
                iter = iter->parent;
            }

            if (!iter) {
                stop = NULL;
                iter = module->data;
            } else if (iter->nodetype == LYS_EXT) {
                stop = iter;
                iter = (struct lys_node *)lys_child(iter, node->nodetype);
                if (iter) {
                    iter = *(struct lys_node **)iter;
                }
            } else {
                stop = iter;
                iter = iter->child;
            }
        } else {
            stop = NULL;
            iter = module->data;
        }
        while (iter) {
            if (iter->nodetype & (LYS_USES | LYS_CASE)) {
                iter = iter->child;
                continue;
            }

            if (iter->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CONTAINER | LYS_CHOICE | LYS_ANYDATA)) {
                if (iter->module == node->module && ly_strequal(iter->name, node->name, 1)) {
                    LOGVAL(module->ctx, LYE_DUPID, LY_VLOG_LYS, node, strnodetype(node->nodetype), node->name);
                    return EXIT_FAILURE;
                }
            }

            /* special case for choice - we must check the choice's name as
             * well as the names of nodes under the choice
             */
            if (iter->nodetype == LYS_CHOICE) {
                iter = iter->child;
                continue;
            }

            /* go to siblings */
            if (!iter->next) {
                /* no sibling, go to parent's sibling */
                do {
                    /* for parent LYS_AUGMENT */
                    if (iter->parent == stop) {
                        iter = stop;
                        break;
                    }
                    iter = lys_parent(iter);
                    if (iter && iter->next) {
                        break;
                    }
                } while (iter != stop);

                if (iter == stop) {
                    break;
                }
            }
            iter = iter->next;
        }
        break;
    case LYS_CASE:
        /* 6.2.1, rule 8 */
        if (parent) {
            start = *lys_child(parent, LYS_CASE);
        } else {
            start = module->data;
        }

        LY_TREE_FOR(start, iter) {
            if (!(iter->nodetype & (LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST))) {
                continue;
            }

            if (iter->module == node->module && ly_strequal(iter->name, node->name, 1)) {
                LOGVAL(module->ctx, LYE_DUPID, LY_VLOG_LYS, node, "case", node->name);
                return EXIT_FAILURE;
            }
        }
        break;
    default:
        /* no check needed */
        break;
    }

    return EXIT_SUCCESS;
}